

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<const_phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>_&>
::MatchAndExplain(UnorderedElementsAreMatcherImpl<const_phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>_&>
                  *this,node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
                        *container,MatchResultListener *listener)

{
  undefined1 auVar1 [16];
  char cVar2;
  undefined1 (*pauVar3) [16];
  pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int> *value;
  uint uVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined1 auVar10 [11];
  undefined1 auVar11 [12];
  undefined1 auVar12 [13];
  undefined1 auVar13 [14];
  size_t sVar14;
  uint uVar15;
  pointer pMVar16;
  pointer pMVar17;
  long lVar18;
  slot_type *pptVar19;
  pointer pcVar20;
  long lVar21;
  size_t sVar22;
  undefined1 (*pauVar23) [16];
  bool bVar24;
  undefined1 auVar25 [16];
  char in_XMM2_Ba;
  char in_XMM2_Bb;
  char in_XMM2_Bc;
  char in_XMM2_Bd;
  char in_XMM2_Be;
  char in_XMM2_Bf;
  char in_XMM2_Bg;
  char in_XMM2_Bh;
  char in_XMM2_Bi;
  char in_XMM2_Bj;
  char in_XMM2_Bk;
  char in_XMM2_Bl;
  char in_XMM2_Bm;
  char in_XMM2_Bn;
  char in_XMM2_Bo;
  byte in_XMM2_Bp;
  vector<char,_std::allocator<char>_> did_match;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  element_printouts;
  MatchMatrix matrix;
  DummyMatchResultListener dummy;
  undefined1 local_248 [16];
  pointer local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  MatchMatrix local_1f0;
  MatchResultListener local_1c8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pauVar3 = (undefined1 (*) [16])
            (container->
            super_raw_hash_map<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
            ).
            super_raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
            .ctrl_;
  pptVar19 = (container->
             super_raw_hash_map<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
             ).
             super_raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
             .slots_;
  cVar2 = (*pauVar3)[0];
  pauVar23 = pauVar3;
  while (cVar2 < -1) {
    auVar1 = *pauVar23;
    iVar6 = -(uint)(CONCAT13(in_XMM2_Bd,CONCAT12(in_XMM2_Bc,CONCAT11(in_XMM2_Bb,in_XMM2_Ba))) ==
                   CONCAT13(in_XMM2_Bd,CONCAT12(in_XMM2_Bc,CONCAT11(in_XMM2_Bb,in_XMM2_Ba))));
    iVar7 = -(uint)(CONCAT13(in_XMM2_Bh,CONCAT12(in_XMM2_Bg,CONCAT11(in_XMM2_Bf,in_XMM2_Be))) ==
                   CONCAT13(in_XMM2_Bh,CONCAT12(in_XMM2_Bg,CONCAT11(in_XMM2_Bf,in_XMM2_Be))));
    iVar8 = -(uint)(CONCAT13(in_XMM2_Bl,CONCAT12(in_XMM2_Bk,CONCAT11(in_XMM2_Bj,in_XMM2_Bi))) ==
                   CONCAT13(in_XMM2_Bl,CONCAT12(in_XMM2_Bk,CONCAT11(in_XMM2_Bj,in_XMM2_Bi))));
    iVar9 = -(uint)(CONCAT13(in_XMM2_Bp,CONCAT12(in_XMM2_Bo,CONCAT11(in_XMM2_Bn,in_XMM2_Bm))) ==
                   CONCAT13(in_XMM2_Bp,CONCAT12(in_XMM2_Bo,CONCAT11(in_XMM2_Bn,in_XMM2_Bm))));
    in_XMM2_Ba = -(auVar1[0] < (char)iVar6);
    in_XMM2_Bb = -(auVar1[1] < (char)((uint)iVar6 >> 8));
    in_XMM2_Bc = -(auVar1[2] < (char)((uint)iVar6 >> 0x10));
    in_XMM2_Bd = -(auVar1[3] < (char)((uint)iVar6 >> 0x18));
    in_XMM2_Be = -(auVar1[4] < (char)iVar7);
    in_XMM2_Bf = -(auVar1[5] < (char)((uint)iVar7 >> 8));
    in_XMM2_Bg = -(auVar1[6] < (char)((uint)iVar7 >> 0x10));
    in_XMM2_Bh = -(auVar1[7] < (char)((uint)iVar7 >> 0x18));
    in_XMM2_Bi = -(auVar1[8] < (char)iVar8);
    in_XMM2_Bj = -(auVar1[9] < (char)((uint)iVar8 >> 8));
    in_XMM2_Bk = -(auVar1[10] < (char)((uint)iVar8 >> 0x10));
    in_XMM2_Bl = -(auVar1[0xb] < (char)((uint)iVar8 >> 0x18));
    in_XMM2_Bm = -(auVar1[0xc] < (char)iVar9);
    in_XMM2_Bn = -(auVar1[0xd] < (char)((uint)iVar9 >> 8));
    in_XMM2_Bo = -(auVar1[0xe] < (char)((uint)iVar9 >> 0x10));
    in_XMM2_Bp = -(auVar1[0xf] < (char)((uint)iVar9 >> 0x18));
    auVar1[1] = in_XMM2_Bb;
    auVar1[0] = in_XMM2_Ba;
    auVar1[2] = in_XMM2_Bc;
    auVar1[3] = in_XMM2_Bd;
    auVar1[4] = in_XMM2_Be;
    auVar1[5] = in_XMM2_Bf;
    auVar1[6] = in_XMM2_Bg;
    auVar1[7] = in_XMM2_Bh;
    auVar1[8] = in_XMM2_Bi;
    auVar1[9] = in_XMM2_Bj;
    auVar1[10] = in_XMM2_Bk;
    auVar1[0xb] = in_XMM2_Bl;
    auVar1[0xc] = in_XMM2_Bm;
    auVar1[0xd] = in_XMM2_Bn;
    auVar1[0xe] = in_XMM2_Bo;
    auVar1[0xf] = in_XMM2_Bp;
    auVar5[1] = in_XMM2_Bb;
    auVar5[0] = in_XMM2_Ba;
    auVar5[2] = in_XMM2_Bc;
    auVar5[3] = in_XMM2_Bd;
    auVar5[4] = in_XMM2_Be;
    auVar5[5] = in_XMM2_Bf;
    auVar5[6] = in_XMM2_Bg;
    auVar5[7] = in_XMM2_Bh;
    auVar5[8] = in_XMM2_Bi;
    auVar5[9] = in_XMM2_Bj;
    auVar5[10] = in_XMM2_Bk;
    auVar5[0xb] = in_XMM2_Bl;
    auVar5[0xc] = in_XMM2_Bm;
    auVar5[0xd] = in_XMM2_Bn;
    auVar5[0xe] = in_XMM2_Bo;
    auVar5[0xf] = in_XMM2_Bp;
    auVar13[1] = in_XMM2_Bd;
    auVar13[0] = in_XMM2_Bc;
    auVar13[2] = in_XMM2_Be;
    auVar13[3] = in_XMM2_Bf;
    auVar13[4] = in_XMM2_Bg;
    auVar13[5] = in_XMM2_Bh;
    auVar13[6] = in_XMM2_Bi;
    auVar13[7] = in_XMM2_Bj;
    auVar13[8] = in_XMM2_Bk;
    auVar13[9] = in_XMM2_Bl;
    auVar13[10] = in_XMM2_Bm;
    auVar13[0xb] = in_XMM2_Bn;
    auVar13[0xc] = in_XMM2_Bo;
    auVar13[0xd] = in_XMM2_Bp;
    auVar12[1] = in_XMM2_Be;
    auVar12[0] = in_XMM2_Bd;
    auVar12[2] = in_XMM2_Bf;
    auVar12[3] = in_XMM2_Bg;
    auVar12[4] = in_XMM2_Bh;
    auVar12[5] = in_XMM2_Bi;
    auVar12[6] = in_XMM2_Bj;
    auVar12[7] = in_XMM2_Bk;
    auVar12[8] = in_XMM2_Bl;
    auVar12[9] = in_XMM2_Bm;
    auVar12[10] = in_XMM2_Bn;
    auVar12[0xb] = in_XMM2_Bo;
    auVar12[0xc] = in_XMM2_Bp;
    auVar11[1] = in_XMM2_Bf;
    auVar11[0] = in_XMM2_Be;
    auVar11[2] = in_XMM2_Bg;
    auVar11[3] = in_XMM2_Bh;
    auVar11[4] = in_XMM2_Bi;
    auVar11[5] = in_XMM2_Bj;
    auVar11[6] = in_XMM2_Bk;
    auVar11[7] = in_XMM2_Bl;
    auVar11[8] = in_XMM2_Bm;
    auVar11[9] = in_XMM2_Bn;
    auVar11[10] = in_XMM2_Bo;
    auVar11[0xb] = in_XMM2_Bp;
    auVar10[1] = in_XMM2_Bg;
    auVar10[0] = in_XMM2_Bf;
    auVar10[2] = in_XMM2_Bh;
    auVar10[3] = in_XMM2_Bi;
    auVar10[4] = in_XMM2_Bj;
    auVar10[5] = in_XMM2_Bk;
    auVar10[6] = in_XMM2_Bl;
    auVar10[7] = in_XMM2_Bm;
    auVar10[8] = in_XMM2_Bn;
    auVar10[9] = in_XMM2_Bo;
    auVar10[10] = in_XMM2_Bp;
    uVar15 = (ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB141(auVar13 >> 7,0) & 1) << 2 |
                      (ushort)(SUB131(auVar12 >> 7,0) & 1) << 3 |
                      (ushort)(SUB121(auVar11 >> 7,0) & 1) << 4 |
                      (ushort)(SUB111(auVar10 >> 7,0) & 1) << 5 |
                      (ushort)((byte)(CONCAT19(in_XMM2_Bp,
                                               CONCAT18(in_XMM2_Bo,
                                                        CONCAT17(in_XMM2_Bn,
                                                                 CONCAT16(in_XMM2_Bm,
                                                                          CONCAT15(in_XMM2_Bl,
                                                                                   CONCAT14(
                                                  in_XMM2_Bk,
                                                  CONCAT13(in_XMM2_Bj,
                                                           CONCAT12(in_XMM2_Bi,
                                                                    CONCAT11(in_XMM2_Bh,in_XMM2_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                      (ushort)((byte)(CONCAT18(in_XMM2_Bp,
                                               CONCAT17(in_XMM2_Bo,
                                                        CONCAT16(in_XMM2_Bn,
                                                                 CONCAT15(in_XMM2_Bm,
                                                                          CONCAT14(in_XMM2_Bl,
                                                                                   CONCAT13(
                                                  in_XMM2_Bk,
                                                  CONCAT12(in_XMM2_Bj,
                                                           CONCAT11(in_XMM2_Bi,in_XMM2_Bh)))))))) >>
                                     7) & 1) << 7 | (ushort)(in_XMM2_Bp >> 7) << 0xf) + 1;
    uVar4 = 0;
    if (uVar15 != 0) {
      for (; (uVar15 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
      }
    }
    pptVar19 = pptVar19 + uVar4;
    cVar2 = (*pauVar23)[uVar4];
    pauVar23 = (undefined1 (*) [16])(*pauVar23 + uVar4);
  }
  sVar14 = (container->
           super_raw_hash_map<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
           ).
           super_raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
           .capacity_;
  local_238 = (pointer)0x0;
  local_248 = (undefined1  [16])0x0;
  local_1c8.stream_ = (ostream *)0x0;
  local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_00208958;
  if (pauVar23 == (undefined1 (*) [16])(*pauVar3 + sVar14)) {
    pMVar17 = (this->matchers_).
              super__Vector_base<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pMVar16 = (this->matchers_).
              super__Vector_base<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    sVar22 = 0;
  }
  else {
    sVar22 = 0;
    do {
      if (listener->stream_ != (ostream *)0x0) {
        value = *pptVar19;
        std::__cxx11::stringstream::stringstream(local_1b8);
        UniversalPrint<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>>
                  (value,local_1a8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228,
                   &local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
      }
      pMVar16 = (this->matchers_).
                super__Vector_base<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pMVar17 = pMVar16;
      if ((this->matchers_).
          super__Vector_base<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pMVar16) {
        lVar18 = 0;
        lVar21 = 0;
        do {
          local_1b8[0] = (stringstream)
                         MatcherBase<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>
                         ::MatchAndExplain((MatcherBase<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>
                                            *)((long)&(pMVar17->
                                                                                                            
                                                  super_MatcherBase<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>
                                                  ).super_MatcherDescriberInterface.
                                                  _vptr_MatcherDescriberInterface + lVar18),
                                           *pptVar19,&local_1c8);
          std::vector<char,_std::allocator<char>_>::emplace_back<char>
                    ((vector<char,_std::allocator<char>_> *)local_248,(char *)local_1b8);
          lVar21 = lVar21 + 1;
          pMVar17 = (this->matchers_).
                    super__Vector_base<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pMVar16 = (this->matchers_).
                    super__Vector_base<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          lVar18 = lVar18 + 0x18;
        } while (lVar21 != ((long)pMVar16 - (long)pMVar17 >> 3) * -0x5555555555555555);
      }
      pptVar19 = pptVar19 + 1;
      cVar2 = (*pauVar23)[1];
      pauVar23 = (undefined1 (*) [16])(*pauVar23 + 1);
      while (cVar2 < -1) {
        auVar25[0] = -((char)(*pauVar23)[0] < -1);
        auVar25[1] = -((char)(*pauVar23)[1] < -1);
        auVar25[2] = -((char)(*pauVar23)[2] < -1);
        auVar25[3] = -((char)(*pauVar23)[3] < -1);
        auVar25[4] = -((char)(*pauVar23)[4] < -1);
        auVar25[5] = -((char)(*pauVar23)[5] < -1);
        auVar25[6] = -((char)(*pauVar23)[6] < -1);
        auVar25[7] = -((char)(*pauVar23)[7] < -1);
        auVar25[8] = -((char)(*pauVar23)[8] < -1);
        auVar25[9] = -((char)(*pauVar23)[9] < -1);
        auVar25[10] = -((char)(*pauVar23)[10] < -1);
        auVar25[0xb] = -((char)(*pauVar23)[0xb] < -1);
        auVar25[0xc] = -((char)(*pauVar23)[0xc] < -1);
        auVar25[0xd] = -((char)(*pauVar23)[0xd] < -1);
        auVar25[0xe] = -((char)(*pauVar23)[0xe] < -1);
        auVar25[0xf] = -((char)(*pauVar23)[0xf] < -1);
        uVar15 = (ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                         (ushort)(auVar25[0xf] >> 7) << 0xf) + 1;
        uVar4 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        pptVar19 = pptVar19 + uVar4;
        cVar2 = (*pauVar23)[uVar4];
        pauVar23 = (undefined1 (*) [16])(*pauVar23 + uVar4);
      }
      sVar22 = sVar22 + 1;
    } while (pauVar23 != (undefined1 (*) [16])(*pauVar3 + sVar14));
  }
  local_1f0.num_matchers_ = ((long)pMVar16 - (long)pMVar17 >> 3) * -0x5555555555555555;
  local_1b8[0] = (stringstream)0x0;
  local_1f0.num_elements_ = sVar22;
  std::vector<char,_std::allocator<char>_>::vector
            (&local_1f0.matched_,local_1f0.num_matchers_ * sVar22,(value_type *)local_1b8,
             (allocator_type *)&local_210);
  if (sVar22 != 0) {
    pMVar17 = (this->matchers_).
              super__Vector_base<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pMVar16 = (this->matchers_).
              super__Vector_base<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    sVar14 = 0;
    pcVar20 = (pointer)local_248._0_8_;
    do {
      bVar24 = pMVar16 != pMVar17;
      pMVar17 = pMVar16;
      if (bVar24) {
        lVar18 = 0;
        do {
          local_1f0.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar18 + local_1f0.num_matchers_ * sVar14] =
               pcVar20[lVar18] != '\0';
          lVar18 = lVar18 + 1;
          pMVar17 = (this->matchers_).
                    super__Vector_base<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pMVar16 = (this->matchers_).
                    super__Vector_base<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        } while (lVar18 != ((long)pMVar16 - (long)pMVar17 >> 3) * -0x5555555555555555);
        pcVar20 = pcVar20 + lVar18;
      }
      sVar14 = sVar14 + 1;
    } while (sVar14 != sVar22);
  }
  if ((pointer)local_248._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_248._0_8_,(long)local_238 - local_248._0_8_);
  }
  bVar24 = UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
                     (&this->super_UnorderedElementsAreMatcherImplBase,&local_228,&local_1f0,
                      listener);
  if (bVar24) {
    bVar24 = UnorderedElementsAreMatcherImplBase::FindPairing
                       (&this->super_UnorderedElementsAreMatcherImplBase,&local_1f0,listener);
  }
  else {
    bVar24 = false;
  }
  if (local_1f0.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f0.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  return bVar24;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    StlContainerReference stl_container = View::ConstReference(container);
    ::std::vector<std::string> element_printouts;
    MatchMatrix matrix =
        AnalyzeElements(stl_container.begin(), stl_container.end(),
                        &element_printouts, listener);

    return VerifyMatchMatrix(element_printouts, matrix, listener) &&
           FindPairing(matrix, listener);
  }